

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O0

bool Assimp::IFC::ProcessProfile(IfcProfileDef *prof,TempMesh *meshout,ConversionData *conv)

{
  size_type sVar1;
  reference pvVar2;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  format local_1b8;
  IfcParameterizedProfileDef *local_40;
  IfcParameterizedProfileDef *cparam;
  IfcArbitraryOpenProfileDef *copen;
  IfcArbitraryClosedProfileDef *cprofile;
  ConversionData *conv_local;
  TempMesh *meshout_local;
  IfcProfileDef *prof_local;
  
  cprofile = (IfcArbitraryClosedProfileDef *)conv;
  conv_local = (ConversionData *)meshout;
  meshout_local = (TempMesh *)prof;
  copen = (IfcArbitraryOpenProfileDef *)
          STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef>
                    ((Object *)
                     ((long)&(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>)
                             ._vptr_ObjectHelper +
                     (long)(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                           _vptr_ObjectHelper[-3]));
  if (copen == (IfcArbitraryOpenProfileDef *)0x0) {
    cparam = (IfcParameterizedProfileDef *)
             STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcArbitraryOpenProfileDef>
                       ((Object *)
                        ((long)&(meshout_local->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (long)(meshout_local->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].x));
    if (cparam == (IfcParameterizedProfileDef *)0x0) {
      local_40 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef>
                           ((Object *)
                            ((long)&(meshout_local->mVerts).
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (long)(meshout_local->mVerts).
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].x));
      if (local_40 == (IfcParameterizedProfileDef *)0x0) {
        STEP::Object::GetClassName_abi_cxx11_
                  (&local_1f8,
                   (Object *)
                   ((long)&(meshout_local->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (long)(meshout_local->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].x));
        std::operator+(&local_1d8,"skipping unknown IfcProfileDef entity, type is ",&local_1f8);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1b8,
                   &local_1d8);
        LogFunctions<Assimp::IFCImporter>::LogWarn(&local_1b8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        return false;
      }
      ProcessParametrizedProfile(local_40,(TempMesh *)conv_local,(ConversionData *)cprofile);
    }
    else {
      ProcessOpenProfile((IfcArbitraryOpenProfileDef *)cparam,(TempMesh *)conv_local,
                         (ConversionData *)cprofile);
    }
  }
  else {
    ProcessClosedProfile
              ((IfcArbitraryClosedProfileDef *)copen,(TempMesh *)conv_local,
               (ConversionData *)cprofile);
  }
  TempMesh::RemoveAdjacentDuplicates((TempMesh *)conv_local);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&conv_local->db);
  if ((sVar1 == 0) ||
     (pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&conv_local->db),
     *pvVar2 < 2)) {
    prof_local._7_1_ = false;
  }
  else {
    prof_local._7_1_ = true;
  }
  return prof_local._7_1_;
}

Assistant:

bool ProcessProfile(const Schema_2x3::IfcProfileDef& prof, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcArbitraryClosedProfileDef* const cprofile = prof.ToPtr<Schema_2x3::IfcArbitraryClosedProfileDef>()) {
        ProcessClosedProfile(*cprofile,meshout,conv);
    }
    else if(const Schema_2x3::IfcArbitraryOpenProfileDef* const copen = prof.ToPtr<Schema_2x3::IfcArbitraryOpenProfileDef>()) {
        ProcessOpenProfile(*copen,meshout,conv);
    }
    else if(const Schema_2x3::IfcParameterizedProfileDef* const cparam = prof.ToPtr<Schema_2x3::IfcParameterizedProfileDef>()) {
        ProcessParametrizedProfile(*cparam,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcProfileDef entity, type is " + prof.GetClassName());
        return false;
    }
    meshout.RemoveAdjacentDuplicates();
    if (!meshout.mVertcnt.size() || meshout.mVertcnt.front() <= 1) {
        return false;
    }
    return true;
}